

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_is_hdr_from_callbacks(stbi_io_callbacks *clbk,void *user)

{
  int iVar1;
  stbi__context s;
  stbi__context sStack_d8;
  
  stbi__start_callbacks(&sStack_d8,clbk,user);
  iVar1 = stbi__hdr_test(&sStack_d8);
  return iVar1;
}

Assistant:

STBIDEF int      stbi_is_hdr_from_callbacks(stbi_io_callbacks const *clbk, void *user)
{
   #ifndef STBI_NO_HDR
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__hdr_test(&s);
   #else
   return 0;
   #endif
}